

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

bool __thiscall llvm::DWARFVerifier::handleDebugAbbrev(DWARFVerifier *this)

{
  DWARFObject *pDVar1;
  uint uVar2;
  uint uVar3;
  DWARFDebugAbbrev *pDVar4;
  long extraout_RDX;
  long extraout_RDX_00;
  
  raw_ostream::operator<<(this->OS,"Verifying .debug_abbrev...\n");
  pDVar1 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  (*pDVar1->_vptr_DWARFObject[9])(pDVar1);
  if (extraout_RDX == 0) {
    uVar2 = 0;
  }
  else {
    pDVar4 = DWARFContext::getDebugAbbrev(this->DCtx);
    uVar2 = verifyAbbrevSection(this,pDVar4);
  }
  (*pDVar1->_vptr_DWARFObject[0x1c])(pDVar1);
  if (extraout_RDX_00 != 0) {
    pDVar4 = DWARFContext::getDebugAbbrevDWO(this->DCtx);
    uVar3 = verifyAbbrevSection(this,pDVar4);
    uVar2 = uVar2 + uVar3;
  }
  return uVar2 == 0;
}

Assistant:

bool DWARFVerifier::handleDebugAbbrev() {
  OS << "Verifying .debug_abbrev...\n";

  const DWARFObject &DObj = DCtx.getDWARFObj();
  unsigned NumErrors = 0;
  if (!DObj.getAbbrevSection().empty())
    NumErrors += verifyAbbrevSection(DCtx.getDebugAbbrev());
  if (!DObj.getAbbrevDWOSection().empty())
    NumErrors += verifyAbbrevSection(DCtx.getDebugAbbrevDWO());

  return NumErrors == 0;
}